

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O2

ggml_tensor * apply_conv2d(ggml_context *ctx,ggml_tensor *input,conv2d_layer *layer)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ggml_tensor *pgVar3;
  
  uVar1 = ggml_conv_2d(ctx,layer->weights,input,1,1,layer->padding,layer->padding,1,1);
  if (layer->batch_normalize == true) {
    uVar2 = ggml_repeat(ctx,layer->rolling_mean,uVar1);
    uVar1 = ggml_sub(ctx,uVar1,uVar2);
    uVar2 = ggml_repeat(ctx,layer->rolling_variance,uVar1);
    uVar2 = ggml_sqrt(ctx,uVar2);
    uVar1 = ggml_div(ctx,uVar1,uVar2);
    uVar2 = ggml_repeat(ctx,layer->scales,uVar1);
    uVar1 = ggml_mul(ctx,uVar1,uVar2);
  }
  uVar2 = ggml_repeat(ctx,layer->biases,uVar1);
  pgVar3 = (ggml_tensor *)ggml_add(ctx,uVar1,uVar2);
  if (layer->activate == true) {
    pgVar3 = (ggml_tensor *)ggml_leaky_relu(0x3dcccccd,ctx,pgVar3,1);
    return pgVar3;
  }
  return pgVar3;
}

Assistant:

static ggml_tensor * apply_conv2d(ggml_context * ctx, ggml_tensor * input, const conv2d_layer & layer)
{
    struct ggml_tensor * result = ggml_conv_2d(ctx, layer.weights, input, 1, 1, layer.padding, layer.padding, 1, 1);
    if (layer.batch_normalize) {
        result = ggml_sub(ctx, result, ggml_repeat(ctx, layer.rolling_mean, result));
        result = ggml_div(ctx, result, ggml_sqrt(ctx, ggml_repeat(ctx, layer.rolling_variance, result)));
        result = ggml_mul(ctx, result, ggml_repeat(ctx, layer.scales, result));
    }
    result = ggml_add(ctx, result, ggml_repeat(ctx, layer.biases, result));
    if (layer.activate) {
        result = ggml_leaky_relu(ctx, result, 0.1f, true);
    }
    return result;
}